

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

ProducerBase * __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
recycle_or_create_producer
          (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this,
          bool isExplicit,bool *recycled)

{
  bool bVar1;
  ProducerBase *pPVar2;
  ExplicitProducer *local_58;
  ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *local_48;
  ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *local_40;
  bool local_31;
  __pointer_type pPStack_30;
  bool expected;
  __pointer_type ptr;
  bool *recycled_local;
  ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *pCStack_18;
  bool isExplicit_local;
  ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this_local;
  
  ptr = (__pointer_type)recycled;
  recycled_local._7_1_ = isExplicit;
  pCStack_18 = this;
  pPStack_30 = std::
               atomic<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
               ::load(&this->producerListTail,memory_order_acquire);
  do {
    if (pPStack_30 == (__pointer_type)0x0) {
      *(undefined1 *)&ptr->_vptr_ProducerBase = 0;
      if ((recycled_local._7_1_ & 1) == 0) {
        local_48 = this;
        local_58 = (ExplicitProducer *)
                   ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
                   create<moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer,moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>*>
                             (&local_48);
      }
      else {
        local_40 = this;
        local_58 = ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
                   create<moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer,moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>*>
                             (&local_40);
      }
      pPVar2 = add_producer(this,&local_58->super_ProducerBase);
      return pPVar2;
    }
    bVar1 = std::atomic<bool>::load
                      (&(pPStack_30->super_ConcurrentQueueProducerTypelessBase).inactive,
                       memory_order_relaxed);
    if ((bVar1) && ((pPStack_30->isExplicit & 1U) == (recycled_local._7_1_ & 1))) {
      local_31 = true;
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        (&(pPStack_30->super_ConcurrentQueueProducerTypelessBase).inactive,&local_31
                         ,false,memory_order_acquire,memory_order_relaxed);
      if (bVar1) {
        *(undefined1 *)&ptr->_vptr_ProducerBase = 1;
        return pPStack_30;
      }
    }
    pPStack_30 = ProducerBase::next_prod(pPStack_30);
  } while( true );
}

Assistant:

ProducerBase* recycle_or_create_producer(bool isExplicit, bool& recycled)
	{
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
		debug::DebugLock lock(implicitProdMutex);
#endif
		// Try to re-use one first
		for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
			if (ptr->inactive.load(std::memory_order_relaxed) && ptr->isExplicit == isExplicit) {
				bool expected = true;
				if (ptr->inactive.compare_exchange_strong(expected, /* desired */ false, std::memory_order_acquire, std::memory_order_relaxed)) {
					// We caught one! It's been marked as activated, the caller can have it
					recycled = true;
					return ptr;
				}
			}
		}
		
		recycled = false;
		return add_producer(isExplicit ? static_cast<ProducerBase*>(create<ExplicitProducer>(this)) : create<ImplicitProducer>(this));
	}